

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::_InternalSerialize
          (BayesianProbitRegressor_Gaussian *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  double dVar1;
  void *data;
  ulong uVar2;
  uint8_t *puVar3;
  int size;
  size_t __n;
  
  dVar1 = this->mean_;
  if (dVar1 != 0.0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      dVar1 = this->mean_;
    }
    *target = '\t';
    *(double *)(target + 1) = dVar1;
    target = target + 9;
  }
  dVar1 = this->precision_;
  if (dVar1 != 0.0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      dVar1 = this->precision_;
    }
    *target = '\x11';
    *(double *)(target + 1) = dVar1;
    target = target + 9;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = uVar2 & 0xfffffffffffffffc;
    data = *(void **)(uVar2 + 8);
    size = (int)*(undefined8 *)(uVar2 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar3;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* BayesianProbitRegressor_Gaussian::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.BayesianProbitRegressor.Gaussian)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // double mean = 1;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_mean = this->_internal_mean();
  uint64_t raw_mean;
  memcpy(&raw_mean, &tmp_mean, sizeof(tmp_mean));
  if (raw_mean != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(1, this->_internal_mean(), target);
  }

  // double precision = 2;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_precision = this->_internal_precision();
  uint64_t raw_precision;
  memcpy(&raw_precision, &tmp_precision, sizeof(tmp_precision));
  if (raw_precision != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(2, this->_internal_precision(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.BayesianProbitRegressor.Gaussian)
  return target;
}